

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_utils.cpp
# Opt level: O3

void __thiscall
spvtools::opt::LoopUtils::PopulateLoopDesc
          (LoopUtils *this,Loop *new_loop,Loop *old_loop,LoopCloningResult *cloning_result)

{
  Instruction *pIVar1;
  uint32_t uVar2;
  undefined8 in_RAX;
  const_iterator cVar3;
  BasicBlock **ppBVar4;
  _Hash_node_base *p_Var5;
  __hashtable *__h;
  __hashtable *__h_1;
  BlockMapTy *this_00;
  uint32_t bb_id;
  undefined8 uStack_38;
  
  p_Var5 = (old_loop->loop_basic_blocks_)._M_h._M_before_begin._M_nxt;
  uStack_38 = in_RAX;
  if (p_Var5 != (_Hash_node_base *)0x0) {
    do {
      uStack_38 = CONCAT44(*(undefined4 *)&p_Var5[1]._M_nxt,(undefined4)uStack_38);
      cVar3 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(cloning_result->old_to_new_bb_)._M_h,
                     (key_type_conflict *)((long)&uStack_38 + 4));
      if (cVar3.
          super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_false>
          ._M_cur == (__node_type *)0x0) goto LAB_0024e567;
      Loop::AddBasicBlock(new_loop,*(BasicBlock **)
                                    ((long)cVar3.
                                           super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_false>
                                           ._M_cur + 0x10));
      p_Var5 = p_Var5->_M_nxt;
    } while (p_Var5 != (_Hash_node_base *)0x0);
  }
  this_00 = &cloning_result->old_to_new_bb_;
  pIVar1 = (old_loop->loop_header_->label_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar2 = 0;
  if (pIVar1->has_result_id_ == true) {
    uVar2 = Instruction::GetSingleWordOperand(pIVar1,(uint)pIVar1->has_type_id_);
  }
  uStack_38 = CONCAT44(uVar2,(undefined4)uStack_38);
  cVar3 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&this_00->_M_h,(key_type_conflict *)((long)&uStack_38 + 4));
  if (cVar3.
      super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_false>.
      _M_cur != (__node_type *)0x0) {
    new_loop->loop_header_ =
         *(BasicBlock **)
          ((long)cVar3.
                 super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_false>
                 ._M_cur + 0x10);
    if (old_loop->loop_latch_ != (BasicBlock *)0x0) {
      pIVar1 = (old_loop->loop_latch_->label_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      uVar2 = 0;
      if (pIVar1->has_result_id_ == true) {
        uVar2 = Instruction::GetSingleWordOperand(pIVar1,(uint)pIVar1->has_type_id_);
      }
      uStack_38 = CONCAT44(uVar2,(undefined4)uStack_38);
      cVar3 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&this_00->_M_h,(key_type_conflict *)((long)&uStack_38 + 4));
      if (cVar3.
          super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_false>
          ._M_cur == (__node_type *)0x0) goto LAB_0024e567;
      Loop::SetLatchBlock(new_loop,*(BasicBlock **)
                                    ((long)cVar3.
                                           super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_false>
                                           ._M_cur + 0x10));
    }
    if (old_loop->loop_continue_ != (BasicBlock *)0x0) {
      pIVar1 = (old_loop->loop_continue_->label_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      uVar2 = 0;
      if (pIVar1->has_result_id_ == true) {
        uVar2 = Instruction::GetSingleWordOperand(pIVar1,(uint)pIVar1->has_type_id_);
      }
      uStack_38 = CONCAT44(uVar2,(undefined4)uStack_38);
      cVar3 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&this_00->_M_h,(key_type_conflict *)((long)&uStack_38 + 4));
      if (cVar3.
          super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_false>
          ._M_cur == (__node_type *)0x0) goto LAB_0024e567;
      Loop::SetContinueBlock
                (new_loop,*(BasicBlock **)
                           ((long)cVar3.
                                  super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_false>
                                  ._M_cur + 0x10));
    }
    if (old_loop->loop_merge_ != (BasicBlock *)0x0) {
      pIVar1 = (old_loop->loop_merge_->label_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      uVar2 = 0;
      if (pIVar1->has_result_id_ == true) {
        uVar2 = Instruction::GetSingleWordOperand(pIVar1,(uint)pIVar1->has_type_id_);
      }
      uStack_38 = CONCAT44(uVar2,(undefined4)uStack_38);
      cVar3 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&this_00->_M_h,(key_type_conflict *)((long)&uStack_38 + 4));
      ppBVar4 = (BasicBlock **)
                ((long)cVar3.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_false>
                       ._M_cur + 0x10);
      if (cVar3.
          super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_false>
          ._M_cur == (__node_type *)0x0) {
        ppBVar4 = &old_loop->loop_merge_;
      }
      Loop::SetMergeBlock(new_loop,*ppBVar4);
    }
    if (old_loop->loop_preheader_ != (BasicBlock *)0x0) {
      pIVar1 = (old_loop->loop_preheader_->label_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      uVar2 = 0;
      if (pIVar1->has_result_id_ == true) {
        uVar2 = Instruction::GetSingleWordOperand(pIVar1,(uint)pIVar1->has_type_id_);
      }
      uStack_38 = CONCAT44(uVar2,(undefined4)uStack_38);
      cVar3 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&this_00->_M_h,(key_type_conflict *)((long)&uStack_38 + 4));
      if (cVar3.
          super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_false>
          ._M_cur != (__node_type *)0x0) {
        Loop::SetPreHeaderBlock
                  (new_loop,*(BasicBlock **)
                             ((long)cVar3.
                                    super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_false>
                                    ._M_cur + 0x10));
      }
    }
    return;
  }
LAB_0024e567:
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

void LoopUtils::PopulateLoopDesc(
    Loop* new_loop, Loop* old_loop,
    const LoopCloningResult& cloning_result) const {
  for (uint32_t bb_id : old_loop->GetBlocks()) {
    BasicBlock* bb = cloning_result.old_to_new_bb_.at(bb_id);
    new_loop->AddBasicBlock(bb);
  }
  new_loop->SetHeaderBlock(
      cloning_result.old_to_new_bb_.at(old_loop->GetHeaderBlock()->id()));
  if (old_loop->GetLatchBlock())
    new_loop->SetLatchBlock(
        cloning_result.old_to_new_bb_.at(old_loop->GetLatchBlock()->id()));
  if (old_loop->GetContinueBlock())
    new_loop->SetContinueBlock(
        cloning_result.old_to_new_bb_.at(old_loop->GetContinueBlock()->id()));
  if (old_loop->GetMergeBlock()) {
    auto it =
        cloning_result.old_to_new_bb_.find(old_loop->GetMergeBlock()->id());
    BasicBlock* bb = it != cloning_result.old_to_new_bb_.end()
                         ? it->second
                         : old_loop->GetMergeBlock();
    new_loop->SetMergeBlock(bb);
  }
  if (old_loop->GetPreHeaderBlock()) {
    auto it =
        cloning_result.old_to_new_bb_.find(old_loop->GetPreHeaderBlock()->id());
    if (it != cloning_result.old_to_new_bb_.end()) {
      new_loop->SetPreHeaderBlock(it->second);
    }
  }
}